

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFourAction.cpp
# Opt level: O0

ActionResults * __thiscall BlueRoomFourAction::Look(BlueRoomFourAction *this)

{
  itemType iVar1;
  string local_68 [32];
  undefined4 local_48;
  string local_38 [8];
  string information;
  BlueRoomFourAction *this_local;
  
  std::__cxx11::string::string(local_38);
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == ROPE) {
    std::__cxx11::string::operator=
              (local_38,
               "The rope appears to be attached to the floor in the middle of the room. There seems to be enough to extend toward each pillar."
              );
  }
  else if (iVar1 == WHITE_PILLAR) {
    std::__cxx11::string::operator=
              (local_38,
               "There appears to be a small hook near the middle of the pillar. Maybe you could tie something to it."
              );
  }
  else {
    if (iVar1 != BLACK_PILLAR) {
      this_local = (BlueRoomFourAction *)AbstractRoomAction::Look(&this->super_AbstractRoomAction);
      goto LAB_0013c82b;
    }
    std::__cxx11::string::operator=
              (local_38,
               "There appears to be a small hook near the middle of the pillar. Maybe you could tie something to it."
              );
  }
  this_local = (BlueRoomFourAction *)operator_new(0x30);
  std::__cxx11::string::string(local_68,local_38);
  ActionResults::ActionResults((ActionResults *)this_local,CURRENT,(string *)local_68);
  std::__cxx11::string::~string(local_68);
LAB_0013c82b:
  local_48 = 1;
  std::__cxx11::string::~string(local_38);
  return (ActionResults *)this_local;
}

Assistant:

ActionResults *BlueRoomFourAction::Look() {

    std::string information;

    switch(commands->getMainItem()) {
        case ROPE:
            information = "The rope appears to be attached to the floor in the middle of the room. There seems to be enough to extend toward each pillar.";
            break;
        case WHITE_PILLAR:
            information = "There appears to be a small hook near the middle of the pillar. Maybe you could tie something to it.";
            break;
        case BLACK_PILLAR:
            information = "There appears to be a small hook near the middle of the pillar. Maybe you could tie something to it.";
            break;
        default:
            return AbstractRoomAction::Look();
    }
    return new ActionResults(CURRENT, information);
}